

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm-builder.cc
# Opt level: O1

Cluster * __thiscall
cnn::HierarchicalSoftmaxBuilder::ReadClusterFile
          (HierarchicalSoftmaxBuilder *this,string *cluster_file,Dict *word_dict)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  char cVar4;
  uint uVar5;
  ostream *poVar6;
  Cluster *this_00;
  istream *piVar7;
  Cluster *pCVar8;
  ulong uVar9;
  uint *puVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  string line;
  string word;
  ifstream in;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2b8;
  uint local_29c;
  HierarchicalSoftmaxBuilder *local_298;
  vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_> *local_290;
  undefined1 *local_288;
  undefined8 local_280;
  undefined1 local_278 [16];
  string local_268;
  Dict *local_248;
  Dict *local_240;
  long local_238 [65];
  
  local_298 = this;
  local_248 = word_dict;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Reading clusters from ",0x16);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(cluster_file->_M_dataplus)._M_p,
                      cluster_file->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ...\n",5);
  std::ifstream::ifstream(local_238,(string *)cluster_file,_S_in);
  local_288 = local_278;
  local_280 = 0;
  local_278[0] = 0;
  local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  this_00 = (Cluster *)operator_new(0xb8);
  Cluster::Cluster(this_00);
  local_240 = &local_298->path_symbols;
  local_290 = &local_298->widx2path;
  do {
    cVar4 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_288,cVar4);
    if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Done reading clusters.\n",0x17);
      if (local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (uint *)0x0) {
        operator_delete(local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_288 != local_278) {
        operator_delete(local_288);
      }
      std::ifstream::~ifstream(local_238);
      return this_00;
    }
    if (local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    uVar5 = (uint)local_280;
    pCVar8 = this_00;
    if ((uint)local_280 != 0) {
      uVar12 = 0;
LAB_00197668:
      uVar9 = (ulong)(uVar12 - 1);
      do {
        uVar12 = uVar12 + 1;
        uVar13 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar13;
        uVar3 = uVar13;
        if (uVar5 <= uVar13) break;
      } while (local_288[uVar9] == ' ' || local_288[uVar9] == '\t');
      do {
        uVar2 = uVar12;
        uVar11 = uVar3;
        if (uVar5 <= uVar3) goto LAB_001976ce;
        if ((local_288[uVar3] == '\t') || (local_288[uVar3] == ' ')) {
          uVar11 = uVar2 - 1;
          goto LAB_001976ce;
        }
        uVar12 = uVar2 + 1;
        uVar3 = uVar2;
      } while( true );
    }
    uVar11 = 0;
    puVar10 = local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar1 = local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
LAB_00197764:
    for (; puVar10 != puVar1; puVar10 = puVar10 + 1) {
      pCVar8 = Cluster::add_child(pCVar8,*puVar10);
    }
    uVar9 = (ulong)(uVar11 - 1);
    do {
      uVar11 = uVar11 + 1;
      uVar12 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar12;
      if (uVar5 <= uVar12) break;
    } while (local_288[uVar9] == ' ' || local_288[uVar9] == '\t');
    while (((uVar3 = uVar11, uVar12 < uVar5 && (local_288[uVar3 - 1] != '\t')) &&
           (local_288[uVar3 - 1] != ' '))) {
      uVar11 = uVar3 + 1;
      uVar12 = uVar3;
    }
    std::__cxx11::string::substr((ulong)&local_268,(ulong)&local_288);
    uVar5 = Dict::Convert(local_248,&local_268);
    Cluster::add_word(pCVar8,uVar5);
    if ((ulong)((long)(local_298->widx2path).
                      super__Vector_base<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(local_298->widx2path).
                      super__Vector_base<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= (ulong)uVar5) {
      std::vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>::resize
                (local_290,(ulong)(uVar5 + 1));
    }
    (local_290->super__Vector_base<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar5] = pCVar8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p);
    }
  } while( true );
LAB_001976ce:
  std::__cxx11::string::substr((ulong)&local_268,(ulong)&local_288);
  local_29c = Dict::Convert(local_240,&local_268);
  if (local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_2b8,
               (iterator)
               local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_29c);
  }
  else {
    *local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = local_29c;
    local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  cVar4 = local_288[uVar3];
  uVar12 = uVar13;
  if (cVar4 == ' ') {
    uVar12 = uVar11 + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  puVar10 = local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar1 = local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((cVar4 != ' ') || (uVar5 <= uVar12)) goto LAB_00197764;
  goto LAB_00197668;
}

Assistant:

Cluster* HierarchicalSoftmaxBuilder::ReadClusterFile(const std::string& cluster_file, Dict* word_dict) {
  cerr << "Reading clusters from " << cluster_file << " ...\n";
  ifstream in(cluster_file);
  assert(in);
  int wc = 0;
  string line;
  vector<unsigned> path;
  Cluster* root = new Cluster();
  while(getline(in, line)) {
    path.clear();
    ++wc;
    const unsigned len = line.size();
    unsigned startp = 0;
    unsigned endp = 0;
    while (startp < len) {
      while (is_ws(line[startp]) && startp < len) { ++startp; }
      endp = startp;
      while (not_ws(line[endp]) && endp < len) { ++endp; }
      string symbol = line.substr(startp, endp - startp);
      path.push_back(path_symbols.Convert(symbol));
      if (line[endp] == ' ') {
        startp = endp + 1;
        continue;
      }
      else {
        break;
      }
    }
    Cluster* node = root;
    for (unsigned symbol : path) {
      node = node->add_child(symbol);
    }

    unsigned startw = endp;
    while (is_ws(line[startw]) && startw < len) { ++startw; }
    unsigned endw = startw;
    while (not_ws(line[endw]) && endw < len) { ++endw; }
    assert(endp > startp);
    assert(startw > endp);
    assert(endw > startw);

    string word = line.substr(startw, endw - startw);
    unsigned widx = word_dict->Convert(word);
    node->add_word(widx);

    if (widx2path.size() <= widx) {
      widx2path.resize(widx + 1);
    }
    widx2path[widx] = node;
  }
  cerr << "Done reading clusters.\n";
  return root;
}